

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

upb_MessageValue upb_MapIterator_Key(upb_Map *map,size_t iter)

{
  upb_StringView key;
  undefined1 local_38 [8];
  upb_strtable_iter i;
  size_t iter_local;
  upb_Map *map_local;
  upb_MessageValue ret;
  
  local_38 = (undefined1  [8])&map->table;
  i.t = (upb_strtable *)iter;
  i.index = iter;
  key = upb_strtable_iter_key((upb_strtable_iter *)local_38);
  _upb_map_fromkey(key,&map_local,(long)map->key_size);
  return _map_local;
}

Assistant:

upb_MessageValue upb_MapIterator_Key(const upb_Map* map, size_t iter) {
  upb_strtable_iter i;
  upb_MessageValue ret;
  i.t = &map->table;
  i.index = iter;
  _upb_map_fromkey(upb_strtable_iter_key(&i), &ret, map->key_size);
  return ret;
}